

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

uint __thiscall OpenMD::SimInfo::getNLocalCutoffGroups(SimInfo *this)

{
  Molecule *i;
  size_t sVar1;
  long in_RDI;
  CutoffGroupIterator ci;
  CutoffGroup *cg;
  MoleculeIterator mi;
  Molecule *mol;
  int nLocalCutoffAtoms;
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  local_30;
  CutoffGroup *local_28;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_20;
  MoleculeIterator *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  iVar2 = 0;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_20);
  __gnu_cxx::
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  ::__normal_iterator(&local_30);
  for (i = beginMolecule((SimInfo *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                         in_stack_ffffffffffffffe8); i != (Molecule *)0x0;
      i = nextMolecule((SimInfo *)CONCAT44(iVar2,in_stack_fffffffffffffff0),(MoleculeIterator *)i))
  {
    local_28 = Molecule::beginCutoffGroup
                         ((Molecule *)CONCAT44(iVar2,in_stack_fffffffffffffff0),(iterator *)i);
    while (local_28 != (CutoffGroup *)0x0) {
      sVar1 = CutoffGroup::getNumAtom((CutoffGroup *)0x14799f);
      iVar2 = iVar2 + (int)sVar1;
      local_28 = Molecule::nextCutoffGroup
                           ((Molecule *)CONCAT44(iVar2,in_stack_fffffffffffffff0),(iterator *)i);
    }
  }
  return (*(int *)(in_RDI + 0x28) - iVar2) + *(int *)(in_RDI + 0x44);
}

Assistant:

unsigned int SimInfo::getNLocalCutoffGroups() {
    int nLocalCutoffAtoms = 0;
    Molecule* mol;
    MoleculeIterator mi;
    CutoffGroup* cg;
    Molecule::CutoffGroupIterator ci;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        nLocalCutoffAtoms += cg->getNumAtom();
      }
    }

    return nAtoms_ - nLocalCutoffAtoms + nCutoffGroups_;
  }